

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O1

void __thiscall Diligent::FixedBlockMemoryAllocator::CreateNewPage(FixedBlockMemoryAllocator *this)

{
  char (*in_RCX) [16];
  long lVar1;
  __hashtable *__this;
  double dVar2;
  undefined1 auVar3 [16];
  string msg;
  string local_38;
  long local_18;
  
  if (this->m_BlockSize == 0) {
    FormatString<char[26],char[16]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_BlockSize > 0",
               in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CreateNewPage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0xcc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::IMemoryAllocator>>
  ::emplace_back<Diligent::FixedBlockMemoryAllocator&>
            ((vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::IMemoryAllocator>>
              *)&this->m_PagePool,this);
  local_38._M_dataplus._M_p = (pointer)&this->m_AvailablePages;
  local_18 = ((long)(this->m_PagePool).
                    super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_PagePool).
                    super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + -1;
  std::
  _Hashtable<unsigned_long,unsigned_long,Diligent::STDAllocator<unsigned_long,Diligent::IMemoryAllocator>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_long,std::__detail::_AllocNode<Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,false>,Diligent::IMemoryAllocator>>>
            ();
  lVar1 = (ulong)this->m_NumBlocksInPage *
          ((long)(this->m_PagePool).
                 super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_PagePool).
                 super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar3._0_8_ = lVar1;
  auVar3._12_4_ = 0x45300000;
  dVar2 = ceil(((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) /
               (double)(this->m_AddrToPageId)._M_h._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->m_AddrToPageId)._M_h,
           (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2);
  return;
}

Assistant:

void FixedBlockMemoryAllocator::CreateNewPage()
{
    VERIFY_EXPR(m_BlockSize > 0);
    m_PagePool.emplace_back(*this);
    m_AvailablePages.insert(m_PagePool.size() - 1);
    m_AddrToPageId.reserve(m_PagePool.size() * m_NumBlocksInPage);
}